

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_rep_timespec.cc
# Opt level: O3

nsync_cpp_time_point_ __thiscall nsync::nsync_to_time_point_(nsync *this,nsync_time t)

{
  return (nsync_cpp_time_point_)((long)this * 1000000000 + t.tv_sec);
}

Assistant:

nsync_cpp_time_point_ nsync_to_time_point_ (nsync_time t) {
	nsync_cpp_time_point_ tp;
	std::chrono::nanoseconds t_ns(NSYNC_TIME_NSEC (t) +
                                      NSYNC_NS_IN_S_ * (int64_t) NSYNC_TIME_SEC (t));
	nsync_cpp_time_point_::duration tp_dur =
		std::chrono::duration_cast<nsync_cpp_time_point_::duration>(t_ns);
	return (tp + tp_dur);
}